

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O3

int google::protobuf::internal::LookUpEnumName
              (EnumEntry *enums,int *sorted_indices,size_t size,int value)

{
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  int iVar4;
  
  piVar1 = sorted_indices + size;
  piVar3 = sorted_indices;
  if (0 < (long)size) {
    do {
      uVar2 = size >> 1;
      iVar4 = value;
      if ((long)piVar3[uVar2] != -1) {
        iVar4 = enums[piVar3[uVar2]].value;
      }
      if (iVar4 < value) {
        piVar3 = piVar3 + uVar2 + 1;
        uVar2 = ~uVar2 + size;
      }
      size = uVar2;
    } while (0 < (long)uVar2);
  }
  iVar4 = -1;
  if ((piVar3 != piVar1) && (enums[*piVar3].value == value)) {
    iVar4 = (int)((ulong)((long)piVar3 - (long)sorted_indices) >> 2);
  }
  return iVar4;
}

Assistant:

int LookUpEnumName(const EnumEntry* enums, const int* sorted_indices,
                   size_t size, int value) {
  auto comparator = [enums, value](int a, int b) {
    return GetValue(enums, a, value) < GetValue(enums, b, value);
  };
  auto it =
      std::lower_bound(sorted_indices, sorted_indices + size, -1, comparator);
  if (it != sorted_indices + size && enums[*it].value == value) {
    return it - sorted_indices;
  }
  return -1;
}